

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O2

void __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::recursive_traversal
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_traversal_wrapper<viennamath::rt_expression_interface<double>_> *fw)

{
  rt_expression_interface<double> *prVar1;
  char cVar2;
  code *UNRECOVERED_JUMPTABLE;
  rt_traversal_wrapper<viennamath::rt_expression_interface<double>_> rVar3;
  
  cVar2 = (**(code **)(*(long *)*fw + 0x18))(*fw,this);
  if (cVar2 == '\0') {
    rVar3 = *fw;
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)rVar3 + 0x10);
    fw = (rt_traversal_wrapper<viennamath::rt_expression_interface<double>_> *)this;
  }
  else {
    prVar1 = (this->lhs_)._M_ptr;
    (*prVar1->_vptr_rt_expression_interface[0xd])(prVar1,fw);
    (**(code **)(*(long *)*fw + 0x10))(*fw,this);
    rVar3 = (rt_traversal_wrapper<viennamath::rt_expression_interface<double>_>)(this->rhs_)._M_ptr;
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)rVar3 + 0x68);
  }
  (*UNRECOVERED_JUMPTABLE)(rVar3,fw);
  return;
}

Assistant:

void recursive_traversal(rt_traversal_wrapper<InterfaceType> const & fw) const
      {
        if (fw.step_into(this))
        {
          lhs_->recursive_traversal(fw);
          fw(this);
          rhs_->recursive_traversal(fw);
        }
        else
          fw(this);
      }